

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-wizard.c
# Opt level: O0

void proj_display(menu *m,wchar_t type,_Bool cursor,wchar_t row,wchar_t col,wchar_t wid)

{
  uint8_t attr_00;
  wchar_t wVar1;
  wchar_t local_58 [2];
  wchar_t chars [6];
  char *proj_name;
  ulong uStack_30;
  uint8_t attr;
  size_t i;
  wchar_t local_20;
  wchar_t wid_local;
  wchar_t col_local;
  wchar_t row_local;
  _Bool cursor_local;
  wchar_t type_local;
  menu *m_local;
  
  attr_00 = curs_attrs[1][(int)(uint)cursor];
  chars._16_8_ = proj_idx_to_name(type);
  if (type % 2 != 0) {
    c_prt(attr_00,".........................",row,col);
  }
  c_put_str(attr_00,(char *)chars._16_8_,row,col);
  local_20 = col + L'\x19';
  if (tile_height == '\x01') {
    for (uStack_30 = 0; uStack_30 < 5; uStack_30 = uStack_30 + 1) {
      if (use_graphics == L'\0') {
        builtin_wcsncpy(chars,L"/-\\",4);
        wVar1 = big_pad(local_20,row,(uint8_t)projections[type].color,chars[uStack_30 - 2]);
      }
      else {
        wVar1 = big_pad(local_20,row,proj_to_attr[type][uStack_30],proj_to_char[type][uStack_30]);
      }
      local_20 = wVar1 + local_20;
    }
  }
  else {
    prt("Change tile_height to 1 to see graphics.",row,local_20);
  }
  return;
}

Assistant:

static void proj_display(struct menu *m, int type, bool cursor,
		int row, int col, int wid)
{
	size_t i;

	uint8_t attr = curs_attrs[CURS_KNOWN][(int)cursor];
	const char *proj_name = proj_idx_to_name(type);

	if (type % 2) c_prt(attr, ".........................", row, col);
	c_put_str(attr, proj_name, row, col);

	col += 25;

	if (tile_height == 1) {
		for (i = 0; i < BOLT_MAX; i++) {
			if (use_graphics == GRAPHICS_NONE) {
				/* ASCII is simple */
				wchar_t chars[] = L"*|/-\\";

				col += big_pad(col, row,
					projections[type].color, chars[i]);
			} else {
				col += big_pad(col, row, proj_to_attr[type][i],
					proj_to_char[type][i]);
			}
		}
	} else {
		prt("Change tile_height to 1 to see graphics.", row, col);
	}
}